

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

double TasGrid::RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)3>
                 (int max_order,int point,double x,bool *isSupported)

{
  int __x;
  double x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double xn;
  bool *isSupported_local;
  double x_local;
  int point_local;
  int max_order_local;
  
  __x = point;
  x_00 = scaleX<(TasGrid::RuleLocal::erule)3>(point,x);
  ::std::abs(__x);
  if (1.0 < extraout_XMM0_Qa) {
    *isSupported = false;
    _point_local = 0.0;
  }
  else {
    *isSupported = true;
    if (max_order == 1) {
      ::std::abs(__x);
      _point_local = 1.0 - extraout_XMM0_Qa_00;
    }
    else if (max_order == 2) {
      _point_local = evalPWQuadratic<(TasGrid::RuleLocal::erule)3>(point,x_00);
    }
    else if (max_order == 3) {
      _point_local = evalPWCubic<(TasGrid::RuleLocal::erule)3>(point,x_00);
    }
    else {
      _point_local = evalPWPower<(TasGrid::RuleLocal::erule)3>(max_order,point,x_00);
    }
  }
  return _point_local;
}

Assistant:

double evalSupport(int max_order, int point, double x, bool &isSupported) {
        switch(effective_rule) {
            case erule::pwc: {
                    double distance = std::abs(x - getNode<effective_rule>(point));
                    double support  = getSupport<effective_rule>(point);
                    isSupported = (distance <= 2.0 * support);
                    return (distance <= support) ? 1.0 : 0.0;
                }
            case erule::localp:
                isSupported = true;
                if (point == 0) {
                    return 1.0;
                } else {
                    double xn = scaleX<effective_rule>(point, x);
                    if (std::abs(xn) <= 1.0) {
                        switch(max_order) {
                            case 1: return 1.0 - std::abs(xn);
                            case 2: return evalPWQuadratic<effective_rule>(point, xn);
                            case 3: return evalPWCubic<effective_rule>(point, xn);
                            default:
                                return evalPWPower<effective_rule>(max_order, point, xn);
                        };
                    } else {
                        isSupported = false;
                        return 0.0;
                    }
                }
            case erule::semilocalp:
                isSupported = true;
                switch(point) {
                    case 0: return 1.0;
                    case 1: return 0.5 * x * (x - 1.0);
                    case 2: return 0.5 * x * (x + 1.0);
                    default: {
                        double xn = scaleX<effective_rule>(point, x);
                        if (std::abs(xn) <= 1.0) {
                            switch(max_order) {
                                case 1: return 1.0 - std::abs(xn);
                                case 2: return evalPWQuadratic<effective_rule>(point, xn);
                                case 3: return evalPWCubic<effective_rule>(point, xn);
                                default:
                                    return evalPWPower<effective_rule>(max_order, point, xn);
                            };
                        } else {
                            isSupported = false;
                            return 0.0;
                        }
                    }
                };
            case erule::localp0:
            default: { // case erule::localpb:
                    double xn = scaleX<effective_rule>(point, x);
                    if (std::abs(xn) <= 1.0) {
                        isSupported = true;
                        switch(max_order) {
                            case 1: return 1.0 - std::abs(xn);
                            case 2: return evalPWQuadratic<effective_rule>(point, xn);
                            case 3: return evalPWCubic<effective_rule>(point, xn);
                            default:
                                return evalPWPower<effective_rule>(max_order, point, xn);
                        };
                    } else {
                        isSupported = false;
                        return 0.0;
                    }
                }
        };
    }